

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

void __thiscall
capnp::TwoPartyServer::AcceptedConnection::AcceptedConnection
          (AcceptedConnection *this,Client *bootstrapInterface,
          Own<kj::AsyncIoStream> *connectionParam)

{
  Own<kj::AsyncIoStream> *other;
  RefOrVoid<kj::AsyncIoStream> stream;
  Client *pCVar1;
  ReaderOptions receiveOptions;
  Client local_58;
  ReaderOptions local_48 [2];
  Own<kj::AsyncIoStream> *local_20;
  Own<kj::AsyncIoStream> *connectionParam_local;
  Client *bootstrapInterface_local;
  AcceptedConnection *this_local;
  
  local_20 = connectionParam;
  connectionParam_local = (Own<kj::AsyncIoStream> *)bootstrapInterface;
  bootstrapInterface_local = (Client *)this;
  other = kj::mv<kj::Own<kj::AsyncIoStream>>(connectionParam);
  kj::Own<kj::AsyncIoStream>::Own(&this->connection,other);
  stream = kj::Own<kj::AsyncIoStream>::operator*(&this->connection);
  local_48[0].traversalLimitInWords = 0;
  local_48[0].nestingLimit = 0;
  local_48[0]._12_4_ = 0;
  ReaderOptions::ReaderOptions(local_48);
  receiveOptions.nestingLimit = local_48[0].nestingLimit;
  receiveOptions.traversalLimitInWords = local_48[0].traversalLimitInWords;
  receiveOptions._12_4_ = 0;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&this->network,stream,SERVER,receiveOptions);
  pCVar1 = kj::mv<capnp::Capability::Client>(bootstrapInterface);
  Capability::Client::Client(&local_58,pCVar1);
  makeRpcServer<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&this->rpcSystem,&(this->network).super_TwoPartyVatNetworkBase,&local_58);
  Capability::Client::~Client(&local_58);
  return;
}

Assistant:

explicit AcceptedConnection(Capability::Client bootstrapInterface,
                              kj::Own<kj::AsyncIoStream>&& connectionParam)
      : connection(kj::mv(connectionParam)),
        network(*connection, rpc::twoparty::Side::SERVER),
        rpcSystem(makeRpcServer(network, kj::mv(bootstrapInterface))) {}